

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::GcAwakeTransientWindowBuffers(ImGuiWindow *window)

{
  window->MemoryCompacted = false;
  ImVector<unsigned_short>::reserve(&window->DrawList->IdxBuffer,window->MemoryDrawListIdxCapacity);
  ImVector<ImDrawVert>::reserve(&window->DrawList->VtxBuffer,window->MemoryDrawListVtxCapacity);
  window->MemoryDrawListIdxCapacity = 0;
  window->MemoryDrawListVtxCapacity = 0;
  return;
}

Assistant:

void ImGui::GcAwakeTransientWindowBuffers(ImGuiWindow* window)
{
    // We stored capacity of the ImDrawList buffer to reduce growth-caused allocation/copy when awakening.
    // The other buffers tends to amortize much faster.
    window->MemoryCompacted = false;
    window->DrawList->IdxBuffer.reserve(window->MemoryDrawListIdxCapacity);
    window->DrawList->VtxBuffer.reserve(window->MemoryDrawListVtxCapacity);
    window->MemoryDrawListIdxCapacity = window->MemoryDrawListVtxCapacity = 0;
}